

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slghpatexpress.cc
# Opt level: O0

PatternBlock * TokenPattern::buildSingle(int4 startbit,int4 endbit,uintm byteval)

{
  uint uVar1;
  PatternBlock *this;
  undefined1 local_20;
  undefined4 local_1c;
  int4 size;
  int4 offset;
  uintm mask;
  uintm byteval_local;
  int4 endbit_local;
  int4 startbit_local;
  
  local_1c = 0;
  local_20 = ((char)endbit - (char)startbit) + '\x01';
  for (byteval_local = startbit; 7 < (int)byteval_local; byteval_local = byteval_local - 8) {
    local_1c = local_1c + 1;
  }
  uVar1 = -1 << (-local_20 & 0x1fU);
  this = (PatternBlock *)operator_new(0x38);
  PatternBlock::PatternBlock
            (this,local_1c,uVar1 >> ((byte)byteval_local & 0x1f),
             (byteval << (-local_20 & 0x1fU) & uVar1) >> ((byte)byteval_local & 0x1f));
  return this;
}

Assistant:

PatternBlock *TokenPattern::buildSingle(int4 startbit,int4 endbit,uintm byteval)

{				// Create a mask/value pattern within a single word
				// The field is given by the bitrange [startbit,endbit]
				// bit 0 is the MOST sig bit of the word
				// use the least sig bits of byteval to fill in
				// the field's value
  uintm mask;
  int4 offset = 0;
  int4 size = endbit-startbit+1;
  while(startbit >= 8) {
    offset += 1;
    startbit -= 8;
    endbit -= 8;
  }
  mask = (~((uintm)0)) << (sizeof(uintm)*8-size);
  byteval = (byteval << (sizeof(uintm)*8-size))& mask;
  mask >>= startbit;
  byteval >>= startbit;
  return new PatternBlock(offset,mask,byteval);
}